

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImRect *pIVar1;
  ImVec2 *pIVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  
  pIVar6 = GImGui;
  if (layer == ImGuiNavLayer_Main) {
    pIVar4 = GImGui->NavWindow;
    pIVar8 = pIVar4->NavLastChildNavWindow;
    if ((pIVar8 == (ImGuiWindow *)0x0) || (pIVar8->WasActive == false)) {
      pIVar8 = pIVar4;
    }
    GImGui->NavWindow = pIVar8;
    pIVar6->NavLastValidSelectionUserData = -1;
    if ((pIVar6->DebugLogFlags & 2) != 0) {
      DebugLog("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n",pIVar4->Name,
               pIVar8->Name);
    }
  }
  pIVar7 = GImGui;
  pIVar4 = pIVar6->NavWindow;
  IVar3 = pIVar4->NavLastIds[layer];
  if (IVar3 != 0) {
    GImGui->NavId = IVar3;
    pIVar7->NavLayer = layer;
    SetNavFocusScope(0);
    pIVar8 = pIVar7->NavWindow;
    pIVar8->NavLastIds[layer] = IVar3;
    IVar5 = pIVar4->NavRectRel[layer].Max;
    pIVar1 = pIVar8->NavRectRel + layer;
    pIVar1->Min = pIVar4->NavRectRel[layer].Min;
    pIVar1->Max = IVar5;
    pIVar2 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
    pIVar2->x = 3.4028235e+38;
    pIVar2->y = 3.4028235e+38;
    return;
  }
  pIVar6->NavLayer = layer;
  NavInitWindow(pIVar4,true);
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
    {
        ImGuiWindow* prev_nav_window = g.NavWindow;
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);    // FIXME-NAV: Should clear ongoing nav requests?
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;
        if (prev_nav_window)
            IMGUI_DEBUG_LOG_FOCUS("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n", prev_nav_window->Name, g.NavWindow->Name);
    }
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}